

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

CECoordinates * __thiscall
CECoordinates::ConvertTo
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,
          CECoordinateType output_coord_type,CEObserver *observer,CEDate *date)

{
  double jd;
  double longitude;
  double latitude;
  double elevation_m;
  double pressure_hPa;
  double temperature_celsius;
  double relative_humidity;
  double dut1;
  double xp;
  double yp;
  double wavelength_um;
  CEDate tmpdate;
  CEDate local_68;
  
  CEDate::CEDate(&local_68,date);
  jd = CEDate::operator_cast_to_double(&local_68);
  longitude = CEObserver::Longitude_Rad(observer);
  latitude = CEObserver::Latitude_Rad(observer);
  elevation_m = CEObserver::Elevation_m(observer);
  pressure_hPa = CEObserver::Pressure_hPa(observer);
  temperature_celsius = CEObserver::Temperature_C(observer);
  relative_humidity = CEObserver::RelativeHumidity(observer);
  dut1 = CEDate::dut1(&local_68);
  xp = CEDate::xpolar(&local_68);
  yp = CEDate::ypolar(&local_68);
  wavelength_um = CEObserver::Wavelength_um(observer);
  ConvertTo(__return_storage_ptr__,this,output_coord_type,jd,longitude,latitude,elevation_m,
            pressure_hPa,temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um);
  CEDate::~CEDate(&local_68);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::ConvertTo(CECoordinateType output_coord_type,
                                       const CEObserver& observer, 
                                       const CEDate& date)
{
    CEDate tmpdate(date);
    return ConvertTo(output_coord_type,
                     tmpdate,
                     observer.Longitude_Rad(),
                     observer.Latitude_Rad(),
                     observer.Elevation_m(),
                     observer.Pressure_hPa(),
                     observer.Temperature_C(),
                     observer.RelativeHumidity(),
                     tmpdate.dut1(),
                     tmpdate.xpolar(),
                     tmpdate.ypolar(),
                     observer.Wavelength_um()) ;
}